

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void Assimp::Write(JSONWriter *out,aiScene *ai)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char cVar4;
  string local_50;
  
  out->first = true;
  puVar1 = &out->field_0x58;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"{\n",2);
  cVar4 = (char)out + '\b';
  std::__cxx11::string::push_back(cVar4);
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__metadata__","");
  JSONWriter::Key(out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  WriteFormatInfo(out);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"rootnode","");
  JSONWriter::Key(out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Write(out,ai->mRootNode,false);
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"flags","");
  JSONWriter::Key(out,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_50,1);
  if ((ai->mMeshes != (aiMesh **)0x0) && (ai->mNumMeshes != 0)) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"meshes","");
    JSONWriter::Key(out,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back(cVar4);
    if (ai->mNumMeshes != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mMeshes[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumMeshes);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mMaterials != (aiMaterial **)0x0) && (ai->mNumMaterials != 0)) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"materials","");
    JSONWriter::Key(out,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back(cVar4);
    if (ai->mNumMaterials != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mMaterials[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumMaterials);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mAnimations != (aiAnimation **)0x0) && (ai->mNumAnimations != 0)) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"animations","");
    JSONWriter::Key(out,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back(cVar4);
    if (ai->mNumAnimations != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mAnimations[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumAnimations);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mLights != (aiLight **)0x0) && (ai->mNumLights != 0)) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"lights","");
    JSONWriter::Key(out,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back(cVar4);
    if (ai->mNumLights != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mLights[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumLights);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mCameras != (aiCamera **)0x0) && (ai->mNumCameras != 0)) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cameras","");
    JSONWriter::Key(out,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back(cVar4);
    if (ai->mNumCameras != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mCameras[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumCameras);
    }
    JSONWriter::EndArray(out);
  }
  if ((ai->mTextures != (aiTexture **)0x0) && (ai->mNumTextures != 0)) {
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"textures","");
    JSONWriter::Key(out,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    out->first = true;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"[\n",2);
    std::__cxx11::string::push_back(cVar4);
    if (ai->mNumTextures != 0) {
      uVar3 = 0;
      do {
        Write(out,ai->mTextures[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ai->mNumTextures);
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiScene& ai) {
    out.StartObj();

    out.Key("__metadata__");
    WriteFormatInfo(out);

    out.Key("rootnode");
    Write(out, *ai.mRootNode, false);

    out.Key("flags");
    out.SimpleValue(ai.mFlags);

    if (ai.HasMeshes()) {
        out.Key("meshes");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMeshes; ++n) {
            Write(out, *ai.mMeshes[n]);
        }
        out.EndArray();
    }

    if (ai.HasMaterials()) {
        out.Key("materials");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMaterials; ++n) {
            Write(out, *ai.mMaterials[n]);
        }
        out.EndArray();
    }

    if (ai.HasAnimations()) {
        out.Key("animations");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumAnimations; ++n) {
            Write(out, *ai.mAnimations[n]);
        }
        out.EndArray();
    }

    if (ai.HasLights()) {
        out.Key("lights");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumLights; ++n) {
            Write(out, *ai.mLights[n]);
        }
        out.EndArray();
    }

    if (ai.HasCameras()) {
        out.Key("cameras");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumCameras; ++n) {
            Write(out, *ai.mCameras[n]);
        }
        out.EndArray();
    }

    if (ai.HasTextures()) {
        out.Key("textures");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumTextures; ++n) {
            Write(out, *ai.mTextures[n]);
        }
        out.EndArray();
    }
    out.EndObj();
}